

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Redux.h
# Opt level: O2

Scalar __thiscall
Eigen::
DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>const,1,2,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,-1,-1,0,-1,-1>,-1,-1,false>,2,-1,false>const,2,1,true>const>>
::redux<Eigen::internal::scalar_sum_op<double,double>>
          (DenseBase<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,double>,Eigen::Transpose<Eigen::Block<Eigen::Transpose<Eigen::Matrix<double,2,1,0,2,1>const>const,1,2,true>const>const,Eigen::Block<Eigen::Block<Eigen::Block<Eigen::Matrix<double,_1,_1,0,_1,_1>,_1,_1,false>,2,_1,false>const,2,1,true>const>>
           *this,scalar_sum_op<double,_double> *func)

{
  ThisEvaluator thisEval;
  Data DStack_38;
  
  internal::
  binary_evaluator<Eigen::CwiseBinaryOp<Eigen::internal::scalar_product_op<double,_double>,_const_Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_const_Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,_-1,_-1,_0,_-1,_-1>,_-1,_-1,_false>,_2,_-1,_false>,_2,_1,_true>_>,_Eigen::internal::IndexBased,_Eigen::internal::IndexBased,_double,_double>
  ::Data::Data(&DStack_38,(XprType *)this);
  return DStack_38.rhsImpl.
         super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>
         .
         super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true,_true>
         .
         super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
         .m_data[1] *
         DStack_38.lhsImpl.
         super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>_>
         .
         super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_Eigen::internal::IndexBased,_double>
         .m_argImpl.
         super_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>
         .
         super_block_evaluator<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true,_true>
         .
         super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
         .m_data[1] +
         *DStack_38.rhsImpl.
          super_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>_>
          .
          super_block_evaluator<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true,_true>
          .
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Block<Eigen::Block<Eigen::Matrix<double,__1,__1,_0,__1,__1>,__1,__1,_false>,_2,__1,_false>,_2,_1,_true>,_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>
          .m_data *
         *DStack_38.lhsImpl.
          super_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>_>
          .
          super_unary_evaluator<Eigen::Transpose<const_Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>,_Eigen::internal::IndexBased,_double>
          .m_argImpl.
          super_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>_>
          .
          super_block_evaluator<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true,_true>
          .
          super_mapbase_evaluator<Eigen::Block<const_Eigen::Transpose<const_Eigen::Matrix<double,_2,_1,_0,_2,_1>_>,_1,_2,_true>,_Eigen::Matrix<double,_1,_2,_1,_1,_2>_>
          .m_data;
}

Assistant:

EIGEN_DEVICE_FUNC EIGEN_STRONG_INLINE typename internal::traits<Derived>::Scalar
DenseBase<Derived>::redux(const Func& func) const
{
  eigen_assert(this->rows()>0 && this->cols()>0 && "you are using an empty matrix");

  typedef typename internal::redux_evaluator<Derived> ThisEvaluator;
  ThisEvaluator thisEval(derived());

  // The initial expression is passed to the reducer as an additional argument instead of
  // passing it as a member of redux_evaluator to help  
  return internal::redux_impl<Func, ThisEvaluator>::run(thisEval, func, derived());
}